

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O1

int __thiscall NetQuantize::quantize_innerproduct(NetQuantize *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  void *__ptr;
  _Base_ptr p_Var3;
  long *plVar4;
  _Base_ptr p_Var5;
  int *piVar6;
  void *pvVar7;
  long *plVar8;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  iterator iVar13;
  size_t sVar14;
  iterator iVar15;
  uint uVar16;
  int unaff_EBP;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  Option opt_q;
  char key [256];
  undefined1 local_2f8 [32];
  Allocator *local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  int local_2c0;
  size_t local_2b8;
  undefined4 local_2b0;
  undefined4 local_2ac;
  Mat local_2a8;
  Mat local_258;
  pointer local_210;
  _Base_ptr local_208;
  Option *local_200;
  _Base_ptr local_1f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_1f0;
  _Base_ptr local_1e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_1e0;
  Mat local_1d8;
  undefined8 local_188;
  undefined8 uStack_180;
  Option local_178;
  char local_138 [264];
  
  pvVar1 = (this->super_ModelWriter).layers;
  uVar16 = (uint)((ulong)((long)(pvVar1->
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar1->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar16) {
    local_1e0 = &this->blob_int8scale_table;
    local_1e8 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1f0 = &this->weight_int8scale_table;
    local_1f8 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_200 = &(this->super_ModelWriter).super_Net.opt;
    uVar17 = 0;
    do {
      iVar11 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar17]->type);
      iVar12 = unaff_EBP;
      if (iVar11 == 0) {
        iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::find(&local_1e0->_M_t,
                        &(((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar17]->name);
        bVar10 = false;
        if (iVar13._M_node != local_1e8) {
          sprintf(local_138,"%s_param_0",
                  ((((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar17]->name)._M_dataplus._M_p);
          local_2f8._0_8_ = local_2f8 + 0x10;
          sVar14 = strlen(local_138);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2f8,local_138,local_138 + sVar14);
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::find(&local_1f0->_M_t,(key_type *)local_2f8);
          if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
            operator_delete((void *)local_2f8._0_8_);
          }
          if (iVar15._M_node == local_1f8) {
            quantize_innerproduct();
            iVar12 = -1;
            bVar10 = true;
          }
          else {
            pLVar2 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar17];
            __ptr = *(void **)(iVar13._M_node + 2);
            p_Var3 = iVar13._M_node[2]._M_parent;
            local_208 = iVar13._M_node[2]._M_left;
            local_2ac = *(undefined4 *)&iVar13._M_node[2]._M_right;
            plVar4 = *(long **)(iVar13._M_node + 3);
            local_188 = iVar13._M_node[3]._M_parent;
            uStack_180 = iVar13._M_node[3]._M_left;
            local_2b0 = *(undefined4 *)&iVar13._M_node[3]._M_right;
            local_210 = *(pointer *)(iVar13._M_node + 4);
            if (p_Var3 != (_Base_ptr)0x0) {
              LOCK();
              p_Var3->_M_color = p_Var3->_M_color + _S_black;
              UNLOCK();
            }
            local_2f8._0_8_ = *(undefined8 *)(iVar15._M_node + 2);
            p_Var5 = iVar15._M_node[2]._M_parent;
            local_2f8._8_4_ = SUB84(p_Var5,0);
            local_2f8._12_4_ = (undefined4)((ulong)p_Var5 >> 0x20);
            local_2f8._16_4_ = SUB84(iVar15._M_node[2]._M_left,0);
            local_2f8._20_4_ = (undefined4)((ulong)iVar15._M_node[2]._M_left >> 0x20);
            local_2f8._24_4_ = *(undefined4 *)&iVar15._M_node[2]._M_right;
            local_2d8 = *(Allocator **)(iVar15._M_node + 3);
            local_2d0 = iVar15._M_node[3]._M_parent;
            uStack_2c8 = iVar15._M_node[3]._M_left;
            local_2c0 = *(int *)&iVar15._M_node[3]._M_right;
            local_2b8 = *(size_t *)(iVar15._M_node + 4);
            if (p_Var5 != (_Base_ptr)0x0) {
              LOCK();
              p_Var5->_M_color = p_Var5->_M_color + _S_black;
              UNLOCK();
            }
            fprintf(_stderr,"quantize_innerproduct %s\n",(pLVar2->name)._M_dataplus._M_p);
            this_00 = &pLVar2[1].name.field_2;
            ncnn::Mat::reshape(&local_1d8,(Mat *)this_00,
                               *(int *)&pLVar2[1].one_blob_only / *(int *)&pLVar2[1]._vptr_Layer,
                               *(int *)&pLVar2[1]._vptr_Layer,(Allocator *)0x0);
            local_258.cstep = 0;
            local_258.data = (void *)0x0;
            local_258.refcount._0_4_ = 0;
            local_258.refcount._4_4_ = 0;
            local_258.elemsize._0_4_ = 0;
            local_258._20_8_ = 0;
            local_258.h = 0;
            local_258.d = 0;
            local_258.c = 0;
            local_258.allocator = (Allocator *)0x0;
            local_258.dims = 0;
            local_258.w = 0;
            local_178.lightmode = local_200->lightmode;
            local_178._1_3_ = *(undefined3 *)&local_200->field_0x1;
            local_178.num_threads = local_200->num_threads;
            local_178.blob_allocator = local_200->blob_allocator;
            local_178.workspace_allocator = local_200->workspace_allocator;
            local_178.openmp_blocktime = local_200->openmp_blocktime;
            local_178.use_winograd_convolution = local_200->use_winograd_convolution;
            local_178.use_sgemm_convolution = local_200->use_sgemm_convolution;
            local_178.use_int8_inference = local_200->use_int8_inference;
            local_178.use_vulkan_compute = local_200->use_vulkan_compute;
            uVar9._0_1_ = local_200->use_bf16_storage;
            uVar9._1_1_ = local_200->use_fp16_packed;
            uVar9._2_1_ = local_200->use_fp16_storage;
            uVar9._3_1_ = local_200->use_fp16_arithmetic;
            uVar9._4_1_ = local_200->use_int8_packed;
            uVar9._5_1_ = local_200->use_int8_storage;
            uVar9._6_1_ = local_200->use_int8_arithmetic;
            uVar9._7_1_ = local_200->use_packing_layout;
            local_178.use_shader_pack8 = local_200->use_shader_pack8;
            local_178.use_subgroup_basic = local_200->use_subgroup_basic;
            local_178.use_subgroup_vote = local_200->use_subgroup_vote;
            local_178.use_subgroup_ballot = local_200->use_subgroup_ballot;
            local_178.use_subgroup_shuffle = local_200->use_subgroup_shuffle;
            local_178.use_image_storage = local_200->use_image_storage;
            local_178.use_tensor_storage = local_200->use_tensor_storage;
            local_178.use_reserved_0 = local_200->use_reserved_0;
            local_178.flush_denormals = local_200->flush_denormals;
            local_178.use_local_pool_allocator = local_200->use_local_pool_allocator;
            local_178.use_shader_local_memory = local_200->use_shader_local_memory;
            local_178.use_cooperative_matrix = local_200->use_cooperative_matrix;
            local_178.use_winograd23_convolution = local_200->use_winograd23_convolution;
            local_178.use_winograd43_convolution = local_200->use_winograd43_convolution;
            local_178.use_winograd63_convolution = local_200->use_winograd63_convolution;
            local_178.use_a53_a55_optimized_kernel = local_200->use_a53_a55_optimized_kernel;
            local_178.use_reserved_7 = local_200->use_reserved_7;
            local_178.use_reserved_8 = local_200->use_reserved_8;
            local_178.use_reserved_9 = local_200->use_reserved_9;
            local_178.use_reserved_10 = local_200->use_reserved_10;
            local_178.use_reserved_11 = local_200->use_reserved_11;
            local_178._32_8_ = uVar9 & 0xffffffffffffff;
            ncnn::quantize_to_int8(&local_1d8,&local_258,(Mat *)local_2f8,&local_178);
            bVar18 = local_258.data != (void *)0x0;
            bVar19 = (long)local_258.c * local_258.cstep != 0;
            iVar12 = -100;
            if (bVar18 && bVar19) {
              iVar12._0_1_ = pLVar2[1].one_blob_only;
              iVar12._1_1_ = pLVar2[1].support_inplace;
              iVar12._2_1_ = pLVar2[1].support_vulkan;
              iVar12._3_1_ = pLVar2[1].support_packing;
              ncnn::Mat::reshape(&local_2a8,&local_258,iVar12,(Allocator *)0x0);
              if ((Mat *)this_00 != &local_2a8) {
                piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                piVar6 = *(int **)((long)&pLVar2[1].name.field_2 + 8);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    pvVar7 = (void *)pLVar2[1].name.field_2._M_allocated_capacity;
                    plVar8 = (long *)pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    if (plVar8 == (long *)0x0) {
                      if (pvVar7 != (void *)0x0) {
                        free(pvVar7);
                      }
                    }
                    else {
                      (**(code **)(*plVar8 + 0x18))();
                    }
                  }
                }
                pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start = 0;
                *(undefined8 *)((long)&pLVar2[1].name.field_2 + 0xc) = 0;
                *(undefined8 *)
                 ((long)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) = 0;
                this_00->_M_allocated_capacity = 0;
                *(undefined8 *)((long)&pLVar2[1].name.field_2 + 8) = 0;
                pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined4 *)
                 &pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = 0;
                pLVar2[1].name.field_2._M_allocated_capacity = (size_type)local_2a8.data;
                *(ulong *)((long)&pLVar2[1].name.field_2 + 8) =
                     CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
                *(ulong *)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data =
                     CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
                *(int *)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_2a8.elempack;
                pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)local_2a8.allocator;
                *(int *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = local_2a8.dims;
                *(int *)((long)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start + 4) = local_2a8.w;
                *(int *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_2a8.h;
                *(int *)((long)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_finish + 4) = local_2a8.d;
                *(int *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = local_2a8.c;
                *(size_t *)
                 &pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data = local_2a8.cstep;
              }
              piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_2a8.allocator == (Allocator *)0x0) {
                    if (local_2a8.data != (void *)0x0) {
                      free(local_2a8.data);
                    }
                  }
                  else {
                    (*(local_2a8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_2a8.cstep = 0;
              local_2a8.data = (void *)0x0;
              local_2a8.refcount._0_4_ = 0;
              local_2a8.refcount._4_4_ = 0;
              local_2a8.elemsize._0_4_ = 0;
              local_2a8.elemsize._4_4_ = 0;
              local_2a8.elempack = 0;
              local_2a8.dims = 0;
              local_2a8.w = 0;
              local_2a8.h = 0;
              local_2a8.d = 0;
              local_2a8.c = 0;
              iVar12 = unaff_EBP;
            }
            piVar6 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_258.allocator == (Allocator *)0x0) {
                  if (local_258.data != (void *)0x0) {
                    free(local_258.data);
                  }
                }
                else {
                  (*(local_258.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_258.cstep = 0;
            local_258.data = (void *)0x0;
            local_258.refcount._0_4_ = 0;
            local_258.refcount._4_4_ = 0;
            local_258.elemsize._0_4_ = 0;
            local_258._20_8_ = 0;
            local_258.dims = 0;
            local_258.w = 0;
            local_258.h = 0;
            local_258.d = 0;
            local_258.c = 0;
            piVar6 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_1d8.allocator == (Allocator *)0x0) {
                  if (local_1d8.data != (void *)0x0) {
                    free(local_1d8.data);
                  }
                }
                else {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_1d8.cstep = 0;
            local_1d8.data = (void *)0x0;
            local_1d8.refcount._0_4_ = 0;
            local_1d8.refcount._4_4_ = 0;
            local_1d8.elemsize._0_4_ = 0;
            local_1d8._20_8_ = 0;
            local_1d8.dims = 0;
            local_1d8.w = 0;
            local_1d8.h = 0;
            local_1d8.d = 0;
            local_1d8.c = 0;
            bVar10 = true;
            if (bVar18 && bVar19) {
              pLVar2[1].support_bf16_storage = true;
              pLVar2[1].support_fp16_storage = false;
              pLVar2[1].support_int8_storage = false;
              pLVar2[1].support_image_storage = false;
              if (&pLVar2[2].userdata != (void **)local_2f8) {
                piVar6 = (int *)CONCAT44(local_2f8._12_4_,local_2f8._8_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                piVar6 = *(int **)&pLVar2[2].typeindex;
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    plVar8 = (long *)pLVar2[2].type.field_2._M_allocated_capacity;
                    if (plVar8 == (long *)0x0) {
                      if (pLVar2[2].userdata != (void *)0x0) {
                        free(pLVar2[2].userdata);
                      }
                    }
                    else {
                      (**(code **)(*plVar8 + 0x18))();
                    }
                  }
                }
                pLVar2[2].name.field_2._M_allocated_capacity = 0;
                *(undefined8 *)&pLVar2[2].field_0x2c = 0;
                *(undefined8 *)((long)&pLVar2[2].type._M_dataplus._M_p + 4) = 0;
                pLVar2[2].userdata = (void *)0x0;
                *(undefined8 *)&pLVar2[2].typeindex = 0;
                *(undefined8 *)((long)&pLVar2[2].type.field_2 + 8) = 0;
                pLVar2[2].name._M_dataplus._M_p = (pointer)0x0;
                *(undefined4 *)&pLVar2[2].name._M_string_length = 0;
                pLVar2[2].userdata = (void *)local_2f8._0_8_;
                *(ulong *)&pLVar2[2].typeindex = CONCAT44(local_2f8._12_4_,local_2f8._8_4_);
                pLVar2[2].type._M_dataplus._M_p =
                     (pointer)CONCAT44(local_2f8._20_4_,local_2f8._16_4_);
                *(undefined4 *)&pLVar2[2].type._M_string_length = local_2f8._24_4_;
                pLVar2[2].type.field_2._M_allocated_capacity = (size_type)local_2d8;
                *(int *)((long)&pLVar2[2].type.field_2 + 8) = (int)local_2d0;
                *(int *)((long)&pLVar2[2].type.field_2 + 0xc) = local_2d0._4_4_;
                *(int *)&pLVar2[2].name._M_dataplus._M_p = (int)uStack_2c8;
                *(int *)((long)&pLVar2[2].name._M_dataplus._M_p + 4) = uStack_2c8._4_4_;
                *(int *)&pLVar2[2].name._M_string_length = local_2c0;
                pLVar2[2].name.field_2._M_allocated_capacity = local_2b8;
              }
              if (p_Var3 != (_Base_ptr)0x0) {
                LOCK();
                p_Var3->_M_color = p_Var3->_M_color + _S_black;
                UNLOCK();
              }
              piVar6 = pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  pvVar7 = *(void **)((long)&pLVar2[2].name.field_2 + 8);
                  plVar8 = *(long **)&pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data;
                  if (plVar8 == (long *)0x0) {
                    if (pvVar7 != (void *)0x0) {
                      free(pvVar7);
                    }
                  }
                  else {
                    (**(code **)(*plVar8 + 0x18))();
                  }
                }
              }
              pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              *(undefined8 *)
               ((long)&pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = 0;
              *(undefined8 *)
               ((long)&pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = 0;
              *(undefined8 *)((long)&pLVar2[2].name.field_2 + 8) = 0;
              pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = 0;
              *(void **)((long)&pLVar2[2].name.field_2 + 8) = __ptr;
              *(_Base_ptr *)
               &pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data = p_Var3;
              pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_208;
              *(undefined4 *)
               &pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = local_2ac;
              *(long **)&pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = plVar4;
              *(undefined4 *)
               &pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (undefined4)local_188;
              *(undefined4 *)
               ((long)&pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = local_188._4_4_;
              *(undefined4 *)
               &pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (undefined4)uStack_180;
              *(undefined4 *)
               ((long)&pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4) = uStack_180._4_4_;
              *(undefined4 *)
               &pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data = local_2b0;
              pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = local_210;
              bVar10 = false;
            }
            piVar6 = (int *)CONCAT44(local_2f8._12_4_,local_2f8._8_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_2d8 == (Allocator *)0x0) {
                  if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
                    free((void *)local_2f8._0_8_);
                  }
                }
                else {
                  (*local_2d8->_vptr_Allocator[3])();
                }
              }
            }
            local_2b8 = 0;
            local_2f8._0_8_ = (pointer)0x0;
            local_2f8._8_4_ = 0;
            local_2f8._12_4_ = 0;
            local_2f8._16_4_ = 0;
            local_2f8._20_4_ = 0;
            local_2f8._24_4_ = 0;
            local_2d0._0_4_ = 0;
            local_2d0._4_4_ = 0;
            uStack_2c8._0_4_ = 0;
            uStack_2c8._4_4_ = 0;
            local_2c0 = 0;
            if (p_Var3 != (_Base_ptr)0x0) {
              LOCK();
              p_Var3->_M_color = p_Var3->_M_color - _S_black;
              UNLOCK();
              if (p_Var3->_M_color == _S_red) {
                if (plVar4 == (long *)0x0) {
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                }
                else {
                  (**(code **)(*plVar4 + 0x18))(plVar4,__ptr);
                }
              }
            }
          }
        }
        if (bVar10) {
          return iVar12;
        }
      }
      uVar17 = uVar17 + 1;
      unaff_EBP = iVar12;
    } while ((uVar16 & 0x7fffffff) != uVar17);
  }
  return 0;
}

Assistant:

int NetQuantize::quantize_innerproduct()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "InnerProduct")
            continue;

        // find InnerProduct layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // InnerProduct - quantize weight from fp32 to int8
        ncnn::InnerProduct* fc = (ncnn::InnerProduct*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_innerproduct %s\n", fc->name.c_str());

        {
            const int num_input = fc->weight_data_size / fc->num_output;

            ncnn::Mat weight_data_r2 = fc->weight_data.reshape(num_input, fc->num_output);

            ncnn::Mat weight_data_int8;
            ncnn::Option opt_q = opt;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            fc->weight_data = weight_data_int8.reshape(fc->weight_data_size);
        }

        fc->int8_scale_term = 2;
        fc->weight_data_int8_scales = weight_data_int8_scales;
        fc->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}